

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void __thiscall
TPZTensor<double>::ComputeEigenvectors(TPZTensor<double> *this,TPZDecomposed *eigensystem)

{
  double dVar1;
  TPZManVector<double,_3> *pTVar2;
  double *pdVar3;
  bool bVar4;
  uint i_1;
  long lVar5;
  long lVar6;
  long lVar7;
  uint i;
  long lVar8;
  uint lambda;
  double dVar9;
  REAL conditionFactor;
  TPZTensor<double> A;
  TPZDecomposed eigensystemTemp;
  
  if (eigensystem->fDistinctEigenvalues == 0) {
    ComputeEigenvalues(this,eigensystem,true);
  }
  else {
    A.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)&eigensystemTemp,3,(double *)&A);
    TPZManVector<double,_3>::operator=
              ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore,
               (TPZManVector<double,_3> *)&eigensystemTemp);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)&eigensystemTemp);
    A.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)&eigensystemTemp,3,(double *)&A);
    TPZManVector<double,_3>::operator=
              ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 1,
               (TPZManVector<double,_3> *)&eigensystemTemp);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)&eigensystemTemp);
    A.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)&eigensystemTemp,3,(double *)&A);
    TPZManVector<double,_3>::operator=
              ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 2,
               (TPZManVector<double,_3> *)&eigensystemTemp);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)&eigensystemTemp);
    if (1 < eigensystem->fDistinctEigenvalues - 2) {
      if (eigensystem->fDistinctEigenvalues == 1) {
        pTVar2 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
        *(pTVar2->super_TPZVec<double>).fStore = 1.0;
        pTVar2[1].super_TPZVec<double>.fStore[1] = 1.0;
        pTVar2[2].super_TPZVec<double>.fStore[2] = 1.0;
        return;
      }
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZTensor.h"
                 ,0x551);
    }
    dVar9 = Norm(this);
    bVar4 = IsDiagonal(this,dVar9 * 1e-12);
    if (bVar4) {
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        lVar6 = 0;
        lVar5 = 0;
        lVar7 = 4;
        while( true ) {
          if (lVar5 == 3) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZTensor.h"
                       ,0x543);
          }
          if (ABS((eigensystem->fEigenvalues).super_TPZVec<double>.fStore[lVar8] -
                  *(double *)
                   ((long)(this->fData).super_TPZVec<double>.fStore + lVar5 * 8 + lVar6 * 4)) <=
              dVar9 * 1e-12) break;
          lVar5 = lVar5 + 1;
          lVar6 = lVar6 + lVar7;
          lVar7 = lVar7 + -2;
        }
        (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore[lVar8].
        super_TPZVec<double>.fStore[lVar5] = 1.0;
      }
    }
    else {
      TPZDecomposed::TPZDecomposed(&eigensystemTemp,eigensystem);
      TPZTensor(&A);
      Precondition(this,&conditionFactor,&A,&eigensystemTemp);
      ComputeEigenvectorsInternal(&A,&eigensystemTemp);
      TPZManVector<TPZManVector<double,_3>,_3>::operator=
                (&eigensystem->fEigenvectors,&eigensystemTemp.fEigenvectors);
      ~TPZTensor(&A);
      TPZDecomposed::~TPZDecomposed(&eigensystemTemp);
    }
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    dVar9 = 0.0;
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      dVar1 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore[lVar8].
              super_TPZVec<double>.fStore[lVar7];
      dVar9 = dVar9 + dVar1 * dVar1;
    }
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    pdVar3 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore[lVar8].
             super_TPZVec<double>.fStore;
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      pdVar3[lVar7] = pdVar3[lVar7] / dVar9;
    }
  }
  return;
}

Assistant:

void TPZTensor<T>::ComputeEigenvectors(TPZDecomposed &eigensystem) const {
    // Eigenvalues not computed yet. Let's do it.
    if (eigensystem.fDistinctEigenvalues == 0) {
        ComputeEigenvalues(eigensystem, true);
    } else {
        eigensystem.fEigenvectors[0] = TPZManVector<T, 3>(3, 0.);
        eigensystem.fEigenvectors[1] = TPZManVector<T, 3>(3, 0.);
        eigensystem.fEigenvectors[2] = TPZManVector<T, 3>(3, 0.);
        switch (eigensystem.fDistinctEigenvalues) {
            case 1:
                eigensystem.fEigenvectors[0][0] = 1.;
                eigensystem.fEigenvectors[1][1] = 1.;
                eigensystem.fEigenvectors[2][2] = 1.;
                return;
            case 2:
            case 3:
            {
                T tol = Norm()*1.e-12;
                if (IsDiagonal(tol)) {
                    for (unsigned int i = 0; i < 3; ++i) {
                        unsigned int j;
                        for (j = 0; j < 3; ++j) {
                            if (AreEqual(eigensystem.fEigenvalues[i], this->operator()(j, j), tol)) {
                                eigensystem.fEigenvectors[i][j] = 1;
                                break;
                            }
                        }
                        if (j == 3) {
                            DebugStop();
                        }
                    }
                } else {
                    REAL conditionFactor;
                    TPZDecomposed eigensystemTemp = eigensystem;
                    TPZTensor<T> A;
                    Precondition(conditionFactor, A, eigensystemTemp);
                    A.ComputeEigenvectorsInternal(eigensystemTemp);
                    eigensystem.fEigenvectors = eigensystemTemp.fEigenvectors;
                }
                break;
            }
            default:
                DebugStop();
        }
    }


    for (unsigned int lambda = 0; lambda < 3; ++lambda) {
        REAL Norm = 0.;
        for (unsigned int i = 0; i < 3; ++i) {
            Norm += pow(TPZExtractVal::val(eigensystem.fEigenvectors[lambda][i]), 2);
        }
        Norm = sqrt(Norm);
        for (unsigned int i = 0; i < 3; ++i) {
            eigensystem.fEigenvectors[lambda][i] /= Norm;
        }
    }
}